

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  const_iterator __cbeg_2;
  pointer pcVar5;
  iterator __beg;
  pointer pcVar6;
  pointer pcVar7;
  difference_type __offset;
  pointer pcVar8;
  long lVar9;
  iterator __beg_1;
  difference_type __offset_1;
  pointer pcVar10;
  int length;
  char *data;
  int local_54;
  string *local_50;
  char *local_48;
  cmsysProcess *local_40;
  double local_38;
  
  local_50 = line;
  local_40 = process;
  local_38 = timeout;
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x54d34f);
  pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  do {
    pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar5 = pcVar8;
    if (pcVar8 != pcVar6) {
      lVar9 = 0;
      do {
        cVar1 = pcVar8[lVar9];
        if (cVar1 == '\r') {
          if (pcVar8 + lVar9 + 1 == pcVar6) {
            pcVar5 = pcVar8 + lVar9;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar10 = pcVar8 + lVar9;
          if ((1 < (ulong)((long)pcVar10 - (long)pcVar6)) || (pcVar10 != pcVar6)) {
            std::__cxx11::string::append((char *)local_50,(ulong)pcVar6);
            pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pcVar5 = pcVar8 + lVar9 + 1;
          if (pcVar5 == pcVar6) {
            return 2;
          }
          pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pcVar7 = pcVar10 + 1;
          if (pcVar5 != pcVar2) {
            memmove(pcVar6,pcVar10 + 1,(size_t)(pcVar2 + (~(ulong)pcVar8 - lVar9)));
            pcVar5 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pcVar7 = pcVar5;
          }
          if (pcVar5 + ~(ulong)pcVar8 + (long)pcVar6 + -lVar9 == pcVar7) {
            return 2;
          }
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar5 + ~(ulong)pcVar8 + (long)pcVar6 + -lVar9;
          return 2;
        }
        lVar3 = lVar9 + 1;
        lVar9 = lVar9 + 1;
        pcVar5 = pcVar6;
      } while (pcVar8 + lVar3 != pcVar6);
    }
    pcVar8 = pcVar5;
    pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar5 = pcVar10;
    if (pcVar10 != pcVar6) {
      lVar9 = 0;
      do {
        cVar1 = pcVar10[lVar9];
        if (cVar1 == '\r') {
          if (pcVar10 + lVar9 + 1 == pcVar6) {
            pcVar5 = pcVar10 + lVar9;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar8 = pcVar10 + lVar9;
          if ((1 < (ulong)((long)pcVar8 - (long)pcVar6)) || (pcVar8 != pcVar6)) {
            std::__cxx11::string::append((char *)local_50,(ulong)pcVar6);
            pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pcVar5 = pcVar10 + lVar9 + 1;
          if (pcVar5 == pcVar6) {
            return 3;
          }
          pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pcVar7 = pcVar8 + 1;
          if (pcVar5 != pcVar2) {
            memmove(pcVar6,pcVar8 + 1,(size_t)(pcVar2 + (~(ulong)pcVar10 - lVar9)));
            pcVar5 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pcVar7 = pcVar5;
          }
          if (pcVar5 + ~(ulong)pcVar10 + (long)pcVar6 + -lVar9 == pcVar7) {
            return 3;
          }
          (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar5 + ~(ulong)pcVar10 + (long)pcVar6 + -lVar9;
          return 3;
        }
        lVar3 = lVar9 + 1;
        lVar9 = lVar9 + 1;
        pcVar5 = pcVar6;
      } while (pcVar10 + lVar3 != pcVar6);
    }
    iVar4 = cmsysProcess_WaitForData(local_40,&local_48,&local_54,&local_38);
    pcVar10 = pcVar5;
    if (iVar4 < 3) {
      if (iVar4 == 2) {
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  ((vector<char,std::allocator<char>> *)out,pcVar8,local_48,local_48 + local_54);
        pcVar8 = pcVar8 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar6);
      }
      else if (iVar4 == 0) {
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar8 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pcVar8 == (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
            iVar4 = 0;
          }
          else {
            std::__cxx11::string::append((char *)local_50,(ulong)pcVar8);
            pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4 = 3;
            if (pcVar8 != (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish) {
              (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar8;
            }
          }
        }
        else {
          std::__cxx11::string::append((char *)local_50,(ulong)pcVar8);
          pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = 2;
          if (pcVar8 != (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
            (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish = pcVar8;
          }
        }
        return iVar4;
      }
    }
    else if (iVar4 == 3) {
      pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)err,pcVar10,local_48,local_48 + local_54);
      pcVar10 = pcVar10 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar6);
    }
    else if (iVar4 == 0xff) {
      return 0xff;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout,
                               std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  while(1)
    {
    // Check for a newline in stdout.
    for(;outiter != out.end(); ++outiter)
      {
      if((*outiter == '\r') && ((outiter+1) == out.end()))
        {
        break;
        }
      else if(*outiter == '\n' || *outiter == '\0')
        {
        std::vector<char>::size_type length = outiter-out.begin();
        if(length > 1 && *(outiter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&out[0], length);
          }
        out.erase(out.begin(), outiter+1);
        return cmsysProcess_Pipe_STDOUT;
        }
      }

    // Check for a newline in stderr.
    for(;erriter != err.end(); ++erriter)
      {
      if((*erriter == '\r') && ((erriter+1) == err.end()))
        {
        break;
        }
      else if(*erriter == '\n' || *erriter == '\0')
        {
        std::vector<char>::size_type length = erriter-err.begin();
        if(length > 1 && *(erriter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&err[0], length);
          }
        err.erase(err.begin(), erriter+1);
        return cmsysProcess_Pipe_STDERR;
        }
      }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if(pipe == cmsysProcess_Pipe_Timeout)
      {
      // Timeout has been exceeded.
      return pipe;
      }
    else if(pipe == cmsysProcess_Pipe_STDOUT)
      {
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), data, data+length);
      outiter = out.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_STDERR)
      {
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), data, data+length);
      erriter = err.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_None)
      {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      if(!out.empty())
        {
        line.append(&out[0], outiter-out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
        }
      else if(!err.empty())
        {
        line.append(&err[0], erriter-err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
        }
      else
        {
        return cmsysProcess_Pipe_None;
        }
      }
    }
}